

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void computeYMD(DateTime *p)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  
  if (p->validYMD != '\0') {
    return;
  }
  if (p->validJD == '\0') {
    p->Y = 2000;
    p->M = 1;
    iVar3 = 1;
    lVar4 = 0x10;
  }
  else {
    auVar1 = SEXT816(p->iJD + 43200000) * SEXT816(0x636ba875fd33dc87);
    iVar5 = (int)(auVar1._8_8_ >> 0x19) - (auVar1._12_4_ >> 0x1f);
    iVar2 = (int)(((double)iVar5 + -1867216.25) / 36524.25);
    iVar3 = iVar2 + 3;
    if (-1 < iVar2) {
      iVar3 = iVar2;
    }
    iVar5 = (iVar5 + iVar2) - (iVar3 >> 2);
    iVar3 = (int)(((double)(iVar5 + 0x5f5) + -122.1) / 365.25);
    iVar2 = (int)((ulong)((long)(iVar3 * 0x8ead) * -0x51eb851f) >> 0x20);
    iVar2 = ((iVar2 >> 5) - (iVar2 >> 0x1f)) + iVar5 + 0x5f5;
    dVar6 = (double)iVar2 / 30.6001;
    iVar5 = (int)dVar6;
    p->D = iVar2 - (int)((double)(int)dVar6 * 30.6001);
    iVar5 = (-(uint)(iVar5 < 0xe) | 0xfffffff3) + iVar5;
    p->M = iVar5;
    iVar3 = (2 < iVar5 ^ 0xffffed95) + iVar3;
    lVar4 = 8;
  }
  *(int *)((long)&p->iJD + lVar4) = iVar3;
  p->validYMD = '\x01';
  return;
}

Assistant:

static void computeYMD(DateTime *p){
  int Z, A, B, C, D, E, X1;
  if( p->validYMD ) return;
  if( !p->validJD ){
    p->Y = 2000;
    p->M = 1;
    p->D = 1;
  }else{
    Z = (int)((p->iJD + 43200000)/86400000);
    A = (int)((Z - 1867216.25)/36524.25);
    A = Z + 1 + A - (A/4);
    B = A + 1524;
    C = (int)((B - 122.1)/365.25);
    D = (36525*C)/100;
    E = (int)((B-D)/30.6001);
    X1 = (int)(30.6001*E);
    p->D = B - D - X1;
    p->M = E<14 ? E-1 : E-13;
    p->Y = p->M>2 ? C - 4716 : C - 4715;
  }
  p->validYMD = 1;
}